

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::TYA(CPU *this)

{
  byte bVar1;
  
  bVar1 = this->Y;
  this->A = bVar1;
  this->field_0x2e = bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0xbe;
  return;
}

Assistant:

void CPU::TYA() {
	A = Y;
	if (A == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (A & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
}